

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option_inl.hpp
# Opt level: O0

int __thiscall
CLI::Option::_add_result
          (Option *this,string *result,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  char cVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  reference pcVar5;
  long lVar6;
  string *in_RDX;
  Option *in_RSI;
  Option *in_RDI;
  bool bVar7;
  char in_stack_00000047;
  string *in_stack_00000048;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var_1;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  bool skipSection;
  size_t ii;
  bool duplicated;
  string nstrs;
  int result_count;
  undefined4 in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  Option *in_stack_fffffffffffffe70;
  value_type *in_stack_fffffffffffffe78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffffe80;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_130;
  undefined1 local_128 [24];
  undefined1 *local_110;
  reference local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f8;
  value_type local_f0;
  undefined1 local_d0 [24];
  undefined1 *local_b8;
  byte local_a9;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  uint local_8c;
  ulong local_88;
  byte local_7d;
  allocator<char> local_6a;
  undefined1 local_69;
  undefined1 *local_68;
  undefined8 local_60;
  string local_58 [31];
  char in_stack_ffffffffffffffc7;
  string *in_stack_ffffffffffffffc8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar8;
  int local_4;
  
  iVar8 = 0;
  uVar3 = ::std::__cxx11::string::size();
  bVar7 = false;
  if (3 < uVar3) {
    pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)in_RSI);
    bVar7 = false;
    if (*pcVar4 == '[') {
      pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)in_RSI);
      bVar7 = false;
      if (*pcVar4 == '[') {
        pcVar4 = (char *)::std::__cxx11::string::back();
        bVar7 = false;
        if (*pcVar4 == ']') {
          in_stack_ffffffffffffffc8 = (string *)::std::__cxx11::string::end();
          local_30 = __gnu_cxx::
                     __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator-((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                  *)in_stack_fffffffffffffe78,
                                 (difference_type)in_stack_fffffffffffffe70);
          pcVar5 = __gnu_cxx::
                   __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_30);
          bVar7 = *pcVar5 == ']';
        }
      }
    }
  }
  if (bVar7) {
    local_69 = 0x5b;
    local_68 = &local_69;
    local_60 = 1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_58,local_68,local_60,&local_6a);
    ::std::allocator<char>::~allocator(&local_6a);
    local_7d = 1;
    for (local_88 = 2; uVar3 = local_88, lVar6 = ::std::__cxx11::string::size(), uVar3 < lVar6 - 2U;
        local_88 = local_88 + 2) {
      pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)in_RSI);
      cVar1 = *pcVar4;
      pcVar4 = (char *)::std::__cxx11::string::operator[]((ulong)in_RSI);
      if (cVar1 != *pcVar4) {
        local_7d = 0;
        break;
      }
      in_stack_fffffffffffffe80 =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)::std::__cxx11::string::operator[]((ulong)in_RSI);
      ::std::__cxx11::string::push_back((char)local_58);
    }
    bVar7 = (local_7d & 1) != 0;
    if (bVar7) {
      ::std::__cxx11::string::push_back((char)local_58);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffe70,
                  (value_type *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      iVar8 = iVar8 + 1;
      local_4 = iVar8;
    }
    local_8c = (uint)bVar7;
    ::std::__cxx11::string::~string(local_58);
    if (local_8c != 0) {
      return local_4;
    }
  }
  if (((((in_RDI->allow_extra_args_ & 1U) != 0) || (iVar2 = get_expected_max(in_RDI), 1 < iVar2)) &&
      (uVar3 = ::std::__cxx11::string::empty(), (uVar3 & 1) == 0)) &&
     ((pcVar4 = (char *)::std::__cxx11::string::front(), *pcVar4 == '[' &&
      (pcVar4 = (char *)::std::__cxx11::string::back(), *pcVar4 == ']')))) {
    in_stack_fffffffffffffe70 = in_RSI;
    ::std::__cxx11::string::pop_back();
    in_RSI = in_stack_fffffffffffffe70;
    local_a0 = ::std::__cxx11::string::begin();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)in_stack_fffffffffffffe70,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_a8 = ::std::__cxx11::string::erase(in_stack_fffffffffffffe70,local_98);
    local_a9 = 0;
    in_stack_fffffffffffffe78 = &local_f0;
    ::std::__cxx11::string::string((string *)in_stack_fffffffffffffe78,(string *)in_RSI);
    detail::split_up(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc7);
    ::std::__cxx11::string::~string((string *)&local_f0);
    local_b8 = local_d0;
    local_f8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    while (bVar7 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffffe70,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
          bVar7) {
      local_108 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_f8);
      uVar3 = ::std::__cxx11::string::empty();
      if ((uVar3 & 1) == 0) {
        in_stack_fffffffffffffe6c =
             _add_result(in_RSI,in_RDX,
                         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)CONCAT44(iVar8,in_stack_ffffffffffffffd8));
        iVar8 = in_stack_fffffffffffffe6c + iVar8;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_f8);
    }
    local_8c = 5;
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_fffffffffffffe80);
    if ((local_a9 & 1) == 0) {
      return iVar8;
    }
  }
  if ((in_RDI->super_OptionBase<CLI::Option>).delimiter_ == '\0') {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffe70,
                (value_type *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    local_4 = iVar8 + 1;
  }
  else {
    lVar6 = ::std::__cxx11::string::find_first_of
                      ((char)in_RSI,
                       (ulong)(uint)(int)(in_RDI->super_OptionBase<CLI::Option>).delimiter_);
    if (lVar6 == -1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffe70,
                  (value_type *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      local_4 = iVar8 + 1;
    }
    else {
      detail::split(in_stack_00000048,in_stack_00000047);
      local_110 = local_128;
      local_130._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      while (bVar7 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)in_stack_fffffffffffffe70,
                                (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68)),
            bVar7) {
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator*(&local_130);
        uVar3 = ::std::__cxx11::string::empty();
        if ((uVar3 & 1) == 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
          iVar8 = iVar8 + 1;
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_130);
      }
      local_8c = 7;
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(in_stack_fffffffffffffe80);
      local_4 = iVar8;
    }
  }
  return local_4;
}

Assistant:

CLI11_INLINE int Option::_add_result(std::string &&result, std::vector<std::string> &res) const {
    int result_count = 0;

    // Handle the vector escape possibility all characters duplicated and starting with [[ ending with ]]
    // this is always a single result
    if(result.size() >= 4 && result[0] == '[' && result[1] == '[' && result.back() == ']' &&
       (*(result.end() - 2) == ']')) {
        // this is an escape clause for odd strings
        std::string nstrs{'['};
        bool duplicated{true};
        for(std::size_t ii = 2; ii < result.size() - 2; ii += 2) {
            if(result[ii] == result[ii + 1]) {
                nstrs.push_back(result[ii]);
            } else {
                duplicated = false;
                break;
            }
        }
        if(duplicated) {
            nstrs.push_back(']');
            res.push_back(std::move(nstrs));
            ++result_count;
            return result_count;
        }
    }

    if((allow_extra_args_ || get_expected_max() > 1) && !result.empty() && result.front() == '[' &&
       result.back() == ']') {  // this is now a vector string likely from the default or user entry

        result.pop_back();
        result.erase(result.begin());
        bool skipSection{false};
        for(auto &var : CLI::detail::split_up(result, ',')) {
            if(!var.empty()) {
                result_count += _add_result(std::move(var), res);
            }
        }
        if(!skipSection) {
            return result_count;
        }
    }
    if(delimiter_ == '\0') {
        res.push_back(std::move(result));
        ++result_count;
    } else {
        if((result.find_first_of(delimiter_) != std::string::npos)) {
            for(const auto &var : CLI::detail::split(result, delimiter_)) {
                if(!var.empty()) {
                    res.push_back(var);
                    ++result_count;
                }
            }
        } else {
            res.push_back(std::move(result));
            ++result_count;
        }
    }
    return result_count;
}